

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O2

size_t __thiscall
CCharmapToLocalUTF8::map
          (CCharmapToLocalUTF8 *this,wchar_t unicode_char,char **output_ptr,size_t *output_len)

{
  size_t sVar1;
  ulong uVar2;
  
  uVar2 = 1;
  if (L'\x7f' < unicode_char) {
    uVar2 = 3 - (ulong)((uint)unicode_char < 0x800);
  }
  if (*output_len < uVar2) {
    sVar1 = 0;
  }
  else {
    utf8_ptr::s_putch(*output_ptr,unicode_char);
    *output_ptr = *output_ptr + uVar2;
    sVar1 = *output_len - uVar2;
  }
  *output_len = sVar1;
  return uVar2;
}

Assistant:

size_t CCharmapToLocalUTF8::map(wchar_t unicode_char, char **output_ptr,
                                size_t *output_len) const
{
    /* get the character size */
    size_t map_len = utf8_ptr::s_wchar_size(unicode_char);
    
    /* if we don't have room for one more character, abort */
    if (*output_len < map_len)
    {
        *output_len = 0;
        return map_len;
    }

    /* store the mapping */
    utf8_ptr::s_putch(*output_ptr, unicode_char);

    /* increment the pointer by the number of characters we copied */
    *output_ptr += map_len;

    /* adjust the remaining output length */
    *output_len -= map_len;

    /* return the size of the result */
    return map_len;
}